

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallSubdirectoryGenerator::~cmInstallSubdirectoryGenerator
          (cmInstallSubdirectoryGenerator *this)

{
  cmInstallSubdirectoryGenerator *this_local;
  
  ~cmInstallSubdirectoryGenerator(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

cmInstallSubdirectoryGenerator::~cmInstallSubdirectoryGenerator() = default;